

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void lj_record_ins(jit_State *J)

{
  IROp1 *pIVar1;
  SnapEntry *pSVar2;
  byte bVar3;
  IROp *pc;
  GCproto *pGVar4;
  GCproto *pGVar5;
  TValue *pTVar6;
  BCIns *pBVar7;
  SnapShot *pSVar8;
  TValue TVar9;
  TraceError TVar10;
  IRRef1 IVar11;
  IRRef1 IVar12;
  BCLine BVar13;
  TRef TVar14;
  uint uVar15;
  uint uVar26;
  uint uVar16;
  LoopEvent LVar17;
  int iVar18;
  BCReg func;
  TRef TVar19;
  TRef TVar20;
  IROp IVar21;
  MMS MVar22;
  TRef *pTVar23;
  ushort uVar24;
  IROpT IVar25;
  uint uVar27;
  IROp IVar28;
  cTValue *basev;
  ulong uVar29;
  undefined4 k;
  ulong uVar30;
  TraceLink linktype;
  int32_t iVar31;
  GCobj *o;
  ushort uVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  TValue *pTVar36;
  ushort uVar37;
  IROp IVar38;
  ulong uVar39;
  ulong uStack_120;
  ulong local_108;
  ulong local_f0;
  TValue local_e8;
  TValue TStack_e0;
  TValue TStack_d8;
  TValue local_d0;
  ulong local_c8;
  uint local_b8;
  IRRef1 IStack_b4;
  undefined2 uStack_b2;
  uint uStack_b0;
  IRRef1 local_ac;
  TRef local_a8;
  undefined4 local_a4;
  ulong local_a0;
  ulong local_98;
  uint local_8c;
  ulong local_88;
  long local_80;
  TValue local_78;
  double local_70;
  TValue local_68;
  TValue local_60;
  TRef local_48;
  TRef local_44;
  TRef local_40;
  TRef local_38;
  undefined4 local_34;
  TraceNo lnk;
  
  switch(J->postproc) {
  case LJ_POST_NONE:
    goto switchD_001491f6_caseD_0;
  case LJ_POST_FIXCOMP:
    uVar33._0_2_ = J[-1].penalty[0x3f].val;
    uVar33._2_2_ = J[-1].penalty[0x3f].reason;
    rec_comp_fixup(J,*(BCIns **)&J[-1].penaltyslot,
                   **(BCIns **)&J[-1].penaltyslot & 1 ^ (uint)(0xfffffffd < uVar33));
  case LJ_POST_FIXGUARD:
  case LJ_POST_FIXGUARDSNAP:
    uVar15._0_2_ = J[-1].penalty[0x3f].val;
    uVar15._2_2_ = J[-1].penalty[0x3f].reason;
    if ((0xfffffffd < uVar15) &&
       (pIVar1 = &(J->fold).ins.field_1.o, *pIVar1 = *pIVar1 ^ 1,
       J->postproc == LJ_POST_FIXGUARDSNAP)) {
      uVar39 = (ulong)(J->cur).nsnap;
      pSVar8 = (J->cur).snap;
      pSVar2 = (J->cur).snapmap + (((uint)pSVar8[uVar39 - 1].nent + pSVar8[uVar39 - 1].mapofs) - 1);
      *pSVar2 = *pSVar2 - 1;
    }
    lj_opt_fold(J);
switchD_001491f6_caseD_4:
    uVar26._0_2_ = J[-1].penalty[0x3f].val;
    uVar26._2_2_ = J[-1].penalty[0x3f].reason;
    if (0xfffffffd < uVar26) {
      for (uVar39 = 0; J->maxslot != uVar39; uVar39 = uVar39 + 1) {
        if ((J->base[uVar39] == 0x2007ffd) && (*(int *)((long)J->L->base + uVar39 * 8 + 4) == -2)) {
          J->base[uVar39] = 0x1007ffe;
          break;
        }
      }
    }
    break;
  case LJ_POST_FIXBOOL:
    goto switchD_001491f6_caseD_4;
  case LJ_POST_FIXCONST:
    pTVar6 = J->L->base;
    pTVar36 = pTVar6;
    for (uVar39 = 0; uVar39 < J->maxslot; uVar39 = uVar39 + 1) {
      if ((J->base[uVar39] == 0x7fff) && (*(int *)((long)pTVar6 + uVar39 * 8 + 4) != -1)) {
        TVar14 = lj_record_constify(J,pTVar36);
        J->base[uVar39] = TVar14;
      }
      pTVar36 = pTVar36 + 1;
    }
    break;
  case LJ_POST_FFRETRY:
    if (0x60 < (byte)*J->pc) {
      return;
    }
  }
  J->postproc = LJ_POST_NONE;
switchD_001491f6_caseD_0:
  if (J->needsnap != '\0') {
    J->needsnap = '\0';
    if (J->pt != (GCproto *)0x0) {
      lj_snap_purge(J);
    }
    lj_snap_add(J);
    J->mergesnap = '\x01';
  }
  if (J->bcskip != '\0') {
    J->bcskip = J->bcskip + 0xff;
    return;
  }
  pc = J->pc;
  if ((J->framedepth == 0) && (J->bc_extent <= (uint)((int)pc - *(int *)&J->bc_min))) {
    TVar10 = LJ_TRERR_LLEAVE;
    goto LAB_0014b0b6;
  }
  if ((J->prof_mode != 0) && (pGVar4 = J->pt, pGVar4 != (GCproto *)0x0)) {
    pGVar5 = J->prev_pt;
    J->prev_pt = pGVar4;
    if (pGVar5 == (GCproto *)0x0 || pGVar5 == pGVar4) {
      if (J->prof_mode == 0x6c) {
        BVar13 = lj_debug_line(pGVar4,(BCPos)((ulong)((long)pc + (-0x40 - (long)pGVar4)) >> 2));
        iVar18 = J->prev_line;
        J->prev_line = BVar13;
        if (iVar18 != BVar13) goto LAB_001492a3;
      }
    }
    else {
      J->prev_line = -1;
LAB_001492a3:
      (J->fold).ins.field_0.ot = 0x1580;
      (J->fold).ins.field_1.op12 = 0;
      lj_opt_fold(J);
      lj_snap_add(J);
    }
  }
  pTVar6 = J->L->base;
  IVar38 = *pc;
  IVar21 = IVar38 & 0xff;
  uVar39 = (ulong)IVar21;
  uStack_b0 = 0;
  uVar33 = IVar38 >> 8 & 0xff;
  uVar29 = (ulong)uVar33;
  uVar24 = lj_bc_mode[uVar39];
  local_8c = uVar24 & 7;
  local_108 = uVar29;
  if ((short)local_8c == 3) {
    TStack_d8 = pTVar6[uVar29];
    TVar14 = J->base[uVar29];
    if (TVar14 == 0) {
      TVar14 = sload(J,uVar33);
    }
    local_108 = (ulong)TVar14;
    uStack_b0 = TVar14;
  }
  uVar33 = uStack_b0;
  uVar30 = (ulong)(IVar38 >> 0x18);
  local_f0 = (ulong)(IVar38 >> 0x10 & 0xff);
  if ((uVar24 >> 3 & 0xf) == 3) {
    local_e8 = pTVar6[uVar30];
    local_b8 = J->base[uVar30];
    if (local_b8 == 0) {
      local_b8 = sload(J,IVar38 >> 0x18);
    }
    uVar30 = (ulong)local_b8;
  }
  else if ((uVar24 >> 3 & 0xf) == 0) {
    uVar30 = 0;
    local_f0 = (ulong)(IVar38 >> 0x10);
  }
  uVar15 = uVar24 >> 7 & 0xf;
  if (uVar15 - 3 < 8) {
    uVar26 = (uint)local_f0;
    switch(uVar15) {
    case 3:
      TStack_e0 = (TValue)*(TValue *)&pTVar6[local_f0].field_2;
      uVar15 = J->base[local_f0];
      if (uVar15 == 0) {
        uVar15 = sload(J,uVar26);
      }
      break;
    default:
      goto switchD_0014940e_caseD_4;
    case 8:
      TStack_e0.field_2.it = ~uVar26;
      uVar15 = uVar26 * 0xffffff + 0x7fff;
      break;
    case 9:
      TStack_e0 = (TValue)*(TValue *)&((TValue *)((ulong)(J->pt->k).ptr32 + local_f0 * 8))->field_2;
      uVar15 = lj_ir_knumint(J,TStack_e0.n);
      break;
    case 10:
      TStack_e0.field_2.field_0 =
           (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)
           ((anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
           ((ulong)(J->pt->k).ptr32 + (long)(int)~uVar26 * 4))->i;
      TStack_e0.field_2.it = 0xfffffffb;
      uVar15 = lj_ir_kgc(J,(GCobj *)(ulong)TStack_e0.u32.lo,IRT_STR);
    }
    IStack_b4 = (IRRef1)uVar15;
    uStack_b2 = (undefined2)(uVar15 >> 0x10);
    local_f0 = (ulong)uVar15;
  }
switchD_0014940e_caseD_4:
  TVar9 = local_e8;
  uVar32 = (ushort)local_f0;
  lnk = (TraceNo)local_f0;
  uVar26 = (uint)uVar30;
  uVar15 = (uint)(local_f0 >> 0x18);
  uVar37 = (ushort)local_108;
  switch(IVar38 & 0xff) {
  case IR_LT:
  case IR_GE:
  case IR_LE:
  case IR_GT:
    if ((((uint)local_108 & 0x1f000000) == 0xa000000) || ((lnk & 0x1f000000) == 0xa000000)) {
      MVar22 = MM_le - ((IVar38 & IR_LE) == IR_LT);
LAB_001496e0:
      rec_mm_comp_cdata(J,(RecordIndex *)&local_e8.field_2,IVar21,MVar22);
    }
    else {
      uVar26 = (uint)(local_108 >> 0x18);
      if ((((short)(uVar32 | uVar37) < 0) ||
          ((((uint)local_108 & 0x1f000000) != 0x4000000 && (5 < (uVar26 & 0x1e) - 0xe)))) ||
         (((lnk & 0x1f000000) != 0x4000000 && (5 < (uVar15 & 0x1e) - 0xe)))) {
        uVar26 = uVar26 & 0x1f;
        uVar27 = uVar26;
        if (uVar26 - 0xf < 5) {
          uVar27 = 0x13;
        }
        uVar16 = uVar15 & 0x1f;
        if ((uVar15 & 0x1f) - 0xf < 5) {
          uVar16 = 0x13;
        }
        if (uVar27 == uVar16) {
LAB_00149c46:
          rec_comp_prep(J);
          if (uVar27 == 4) {
            iVar18 = lj_ir_strcmp((GCstr *)(TStack_d8.u64 & 0xffffffff),
                                  (GCstr *)(TStack_e0.u64 & 0xffffffff),IVar21);
            IVar28 = iVar18 == 0 ^ IVar21;
            TVar14 = lj_ir_call(J,IRCALL_lj_str_cmp,local_108,local_f0);
            local_108 = (ulong)TVar14;
            TVar14 = lj_ir_kint(J,0);
            local_f0 = (ulong)TVar14;
            uVar24 = 0x93;
          }
          else {
            if (uVar27 != 0x13) {
              if (uVar27 != 0xe) {
                local_b8 = uVar33;
                while( true ) {
                  MVar22 = MM_le - ((uVar39 & 2) == 0);
                  local_e8 = TStack_d8;
                  iVar18 = lj_record_mm_lookup(J,(RecordIndex *)&local_e8.field_2,MVar22);
                  TVar14 = local_a8;
                  if (iVar18 != 0) break;
LAB_00149d41:
                  if ((uVar39 & 2) == 0) goto LAB_0014a394;
                  local_b8 = CONCAT22(uStack_b2,IStack_b4);
                  IStack_b4 = (IRRef1)uStack_b0;
                  uStack_b2 = (undefined2)(uStack_b0 >> 0x10);
                  TVar9.u64 = TStack_e0.u64;
                  TStack_e0.u64 = TStack_d8.u64;
                  uVar39 = (ulong)((uint)uVar39 ^ 3);
                  TStack_d8.u64 = TVar9.u64;
                  uStack_b0 = local_b8;
                }
                local_78 = local_d0;
                if (TStack_e0._4_4_ == 0xfffffff3) {
                  if (local_c8 != *(uint *)((TStack_e0.u64 & 0xffffffff) + 0x10)) goto LAB_00149cf2;
                  IVar11 = 0xb;
LAB_0014af23:
                  (J->fold).ins.field_0.ot = 0x440b;
                  (J->fold).ins.field_0.op1 = IStack_b4;
                  (J->fold).ins.field_0.op2 = IVar11;
                  TVar14 = lj_opt_fold(J);
                  (J->fold).ins.field_0.ot = 0x88b;
                  (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
                  (J->fold).ins.field_0.op2 = local_ac;
                  lj_opt_fold(J);
                }
                else {
                  if ((TStack_e0._4_4_ == 0xfffffff4) &&
                     (local_c8 == *(uint *)((TStack_e0.u64 & 0xffffffff) + 0x10))) {
                    IVar11 = 5;
                    goto LAB_0014af23;
                  }
LAB_00149cf2:
                  local_b8 = CONCAT22(uStack_b2,IStack_b4);
                  local_e8.u64 = TStack_e0.u64;
                  iVar18 = lj_record_mm_lookup(J,(RecordIndex *)&local_e8.field_2,MVar22);
                  if ((iVar18 == 0) ||
                     (iVar18 = lj_record_objcmp(J,TVar14,local_a8,&local_78,&local_d0), iVar18 != 0)
                     ) goto LAB_00149d41;
                }
                rec_mm_callcomp(J,(RecordIndex *)&local_e8.field_2,(uint)uVar39);
                break;
              }
              goto LAB_0014a659;
            }
            iVar18 = lj_ir_numcmp(TStack_d8.n,TStack_e0.n,IVar21);
            IVar28 = iVar18 == 0 ^ IVar21;
            uVar24 = 0x93;
          }
        }
        else {
          if ((uVar27 == 0x13) && (uVar16 == 0xe)) {
            (J->fold).ins.field_0.op1 = uVar37;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d3;
            TVar14 = lj_opt_fold(J);
            local_108 = (ulong)TVar14;
          }
          else {
            if ((uVar27 != 0xe) || (uVar16 != 0x13)) {
              if ((1 < uVar27 - 1) || (uVar27 = uVar26, 1 < uVar16 - 1)) break;
              goto LAB_00149c46;
            }
            (J->fold).ins.field_0.op1 = uVar32;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d3;
            TVar14 = lj_opt_fold(J);
            local_f0 = (ulong)TVar14;
          }
          rec_comp_prep(J);
LAB_0014a659:
          IVar21 = IVar38 * 4 & IR_ULT ^ IVar21;
          iVar18 = lj_ir_numcmp(TStack_d8.n,TStack_e0.n,IVar21);
          IVar28 = IVar21 ^ IR_UGE;
          if (iVar18 != 0) {
            IVar28 = IVar21;
          }
          uVar24 = 0x8e;
        }
        (J->fold).ins.field_0.ot = (ushort)(IVar28 << 8) | uVar24;
        (J->fold).ins.field_0.op1 = (IRRef1)local_108;
        (J->fold).ins.field_0.op2 = (IRRef1)local_f0;
        lj_opt_fold(J);
        rec_comp_fixup(J,J->pc,(IVar38 ^ IVar28) & IR_GE);
      }
    }
    break;
  case IR_ULT:
  case IR_UGE:
  case IR_ULE:
  case IR_UGT:
  case IR_EQ:
  case IR_NE:
  case IR_ABC:
  case IR_RETF:
    uVar33 = (uint)local_108 & 0x1f000000;
    if ((uVar33 == 0xa000000) || ((lnk & 0x1f000000) == 0xa000000)) {
      MVar22 = MM_eq;
      goto LAB_001496e0;
    }
    if ((((short)(uVar32 | uVar37) < 0) || (uVar33 == 0xb000000)) || (uVar33 == 0xc000000)) {
      rec_comp_prep(J);
      iVar18 = lj_record_objcmp(J,(uint)local_108,lnk,&TStack_d8,&TStack_e0);
      if ((iVar18 == 2) || ((uVar33 != 0xb000000 && (uVar33 != 0xc000000)))) {
        rec_comp_fixup(J,J->pc,(byte)(iVar18 != 0 ^ (byte)IVar38) & 1);
      }
      else if (iVar18 == 1) {
        local_b8 = uStack_b0;
        local_e8 = TStack_d8;
        iVar18 = lj_record_mm_lookup(J,(RecordIndex *)&local_e8.field_2,MM_eq);
        TVar14 = local_a8;
        if (iVar18 != 0) {
          local_78 = local_d0;
          if (TStack_e0._4_4_ == 0xfffffff3) {
            if (local_c8 != *(uint *)((TStack_e0.u64 & 0xffffffff) + 0x10)) goto LAB_0014a939;
            IVar11 = 0xb;
LAB_0014ad2b:
            (J->fold).ins.field_0.ot = 0x440b;
            (J->fold).ins.field_0.op1 = IStack_b4;
            (J->fold).ins.field_0.op2 = IVar11;
            TVar14 = lj_opt_fold(J);
            (J->fold).ins.field_0.ot = 0x88b;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
            (J->fold).ins.field_0.op2 = local_ac;
            lj_opt_fold(J);
          }
          else {
            if ((TStack_e0._4_4_ == 0xfffffff4) &&
               (local_c8 == *(uint *)((TStack_e0.u64 & 0xffffffff) + 0x10))) {
              IVar11 = 5;
              goto LAB_0014ad2b;
            }
LAB_0014a939:
            local_b8 = CONCAT22(uStack_b2,IStack_b4);
            local_e8.u64 = TStack_e0.u64;
            iVar18 = lj_record_mm_lookup(J,(RecordIndex *)&local_e8.field_2,MM_eq);
            if ((iVar18 == 0) ||
               (iVar18 = lj_record_objcmp(J,TVar14,local_a8,&local_78,&local_d0), iVar18 != 0))
            break;
          }
          rec_mm_callcomp(J,(RecordIndex *)&local_e8.field_2,IVar21);
        }
      }
    }
    break;
  case IR_NOP:
  case IR_BASE:
    if ((((local_f0 & 0x1e000000) == 0 ^ (byte)IVar38) & 1) != 0) {
      local_f0 = 0;
    }
  case IR_PVAL:
  case IR_GCSTEP:
    if ((uint)*(byte *)((long)pc + 5) < J->maxslot) {
      J->maxslot = (uint)*(byte *)((long)pc + 5);
    }
    break;
  case IR_HIOP:
  case IR_LOOP:
    if (lnk == 5) {
      uVar33 = lj_ir_tostr(J,(uint)local_108);
LAB_0014a3f4:
      local_108 = (ulong)uVar33;
    }
    else if (lnk == 0xf) {
      uVar33 = lj_ir_tonum(J,(uint)local_108);
      goto LAB_0014a3f4;
    }
    J->base[uVar29] = (TRef)local_108;
    break;
  case IR_USE:
    if (J->maxslot < (uint)local_108) {
      J->base[(uint)local_108 - 1] = 0;
    }
    break;
  case IR_PHI:
    uVar39 = local_f0 & 0x1e000000;
    local_f0 = 0x1007ffe;
    if (uVar39 == 0) {
      local_f0 = 0x2007ffd;
    }
  case IR_BROL:
  case IR_SUB:
  case IR_MUL:
  case IR_CALLA:
switchD_001494bd_caseD_27:
    break;
  case IR_RENAME:
    if ((lnk & 0x1f000000) == 0x4000000 || (uVar15 & 0x1e) - 0xe < 6) {
      uVar33 = lj_opt_narrow_unm(J,lnk,&TStack_e0);
      goto LAB_001498ad;
    }
    local_e8.u64 = TStack_e0.u64;
    MVar22 = MM_unm;
    local_b8 = lnk;
    goto LAB_0014a462;
  case IR_PROF:
    if ((lnk & 0x1f000000) == 0xb000000) {
      uVar33 = lj_ir_call(J,IRCALL_lj_tab_len,local_f0);
      goto LAB_001498ad;
    }
    if ((lnk & 0x1f000000) == 0x4000000) {
      (J->fold).ins.field_0.op1 = uVar32;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x44130000;
      goto LAB_00149f24;
    }
    local_78.u64 = TStack_e0.u64;
    local_48 = lnk;
    iVar18 = lj_record_mm_lookup(J,(RecordIndex *)&local_78.field_2,MM_FAST);
    if (iVar18 == 0) {
      TVar10 = LJ_TRERR_NOMM;
      goto LAB_0014b0b6;
    }
    func = rec_mm_prep(J,lj_cont_ra);
    pTVar23 = J->base;
    uVar39 = (ulong)func;
    pTVar6 = J->L->base;
    pTVar23[uVar39] = local_38;
    pTVar6[uVar39] = local_60;
    pTVar23[uVar39 + 1] = lnk;
    pTVar6[uVar39 + 1].field_2 = (anon_struct_8_2_fd66bcdd_for_TValue_2)TStack_e0;
    pTVar23[uVar39 + 2] = 0x7fff;
    *(undefined4 *)((long)pTVar6 + uVar39 * 8 + 0x14) = 0xffffffff;
    lj_record_call(J,func,2);
    goto LAB_0014a467;
  case IR_KPRI:
  case IR_KINT:
  case IR_KGC:
  case IR_KPTR:
  case IR_BSWAP:
  case IR_BAND:
  case IR_BOR:
  case IR_BXOR:
    uVar39 = local_f0;
    local_f0 = uVar30;
    goto LAB_001495f9;
  case IR_KKPTR:
  case IR_BSHL:
    local_f0 = uVar30;
    uVar26 = lnk;
LAB_00149787:
    if (((((uint)local_f0 & 0x1f000000) != 0x4000000) &&
        (5 < ((uint)(local_f0 >> 0x18) & 0x1e) - 0xe)) ||
       ((uVar26 & 0x1f000000) != 0x4000000 && 5 < (uVar26 >> 0x18 & 0x1e) - 0xe)) {
      MVar22 = MM_mod;
      goto LAB_0014a462;
    }
    uVar33 = lj_opt_narrow_mod(J,(uint)local_f0,uVar26,&local_e8,&TStack_e0);
    goto LAB_001498ad;
  case IR_KNULL:
  case IR_KNUM:
  case IR_KINT64:
  case IR_KSLOT:
  case IR_BNOT:
    IStack_b4 = (IRRef1)uVar30;
    uStack_b2 = (undefined2)(uVar30 >> 0x10);
    TStack_d8 = local_e8;
    local_e8.u64 = TStack_e0.u64;
    TStack_e0 = TVar9;
    uVar39 = uVar30;
    local_b8 = lnk;
    if (IVar21 == IR_BNOT) goto LAB_00149787;
LAB_001495f9:
    lnk = (TraceNo)uVar39;
    uVar26 = (uint)local_f0;
    if ((((uVar26 & 0x1f000000) == 0x4000000) || (((uint)(local_f0 >> 0x18) & 0x1e) - 0xe < 6)) &&
       ((lnk & 0x1f000000) == 0x4000000 || ((uint)(uVar39 >> 0x18) & 0x1e) - 0xe < 6)) {
      IVar38 = (uVar24 >> 0xb) + IR_BNOT;
LAB_00149662:
      uVar33 = lj_opt_narrow_arith(J,uVar26,lnk,&local_e8,&TStack_e0,IVar38);
      goto LAB_001498ad;
    }
    MVar22 = (MMS)(uVar24 >> 0xb);
LAB_0014a462:
    rec_mm_arith(J,(RecordIndex *)&local_e8.field_2,MVar22);
    goto LAB_0014a467;
  case IR_BSHR:
    if (((uVar26 & 0x1f000000) != 0x4000000 && 5 < ((uint)(uVar30 >> 0x18) & 0x1e) - 0xe) ||
       ((lnk & 0x1f000000) != 0x4000000 && 5 < (uVar15 & 0x1e) - 0xe)) {
      MVar22 = MM_pow;
      goto LAB_0014a462;
    }
    IVar38 = IR_POW;
    goto LAB_00149662;
  case IR_BSAR:
    TVar14 = rec_cat(J,uVar26,lnk);
    local_f0 = (ulong)TVar14;
    if (0xfffffeff < TVar14) {
      lj_err_throw(J->L,-TVar14);
    }
    break;
  case IR_BROR:
    uVar33 = lj_ir_kgc(J,(GCobj *)(ulong)*(uint *)((ulong)(J->pt->k).ptr32 + ~local_f0 * 4),
                       IRT_CDATA);
    goto LAB_001498ad;
  case IR_ADD:
    uVar33 = lj_ir_kint(J,(int)(short)uVar32);
    goto LAB_001498ad;
  case IR_DIV:
    for (; (uint)local_108 <= lnk; local_108 = (ulong)((uint)local_108 + 1)) {
      J->base[local_108] = 0x7fff;
    }
    if (J->maxslot <= lnk) {
      J->maxslot = lnk + 1;
    }
    break;
  case IR_MOD:
    uVar33 = rec_upvalue(J,lnk,0);
    goto LAB_001498ad;
  case IR_POW:
  case IR_NEG:
  case IR_ABS:
  case IR_LDEXP:
    rec_upvalue(J,(uint)local_108,lnk);
    break;
  case IR_MIN:
  case IR_MAX:
  case IR_SLOAD:
  case IR_ASTORE:
switchD_001494bd_caseD_32:
    (J->errinfo).n = (double)IVar21;
    lj_trace_err_info(J,LJ_TRERR_NYIBC);
  case IR_FPMATH:
    IVar11 = 0x801;
    if ((lnk & 0x7ff) != 0x7ff) {
      IVar11 = (IRRef1)(lnk & 0x7ff);
    }
    (J->fold).ins.field_0.ot = 0x4f8b;
    (J->fold).ins.field_0.op1 = IVar11;
    (J->fold).ins.field_0.op2 = (IRRef1)(lnk >> 0xb);
    goto LAB_00149f24;
  case IR_ADDOV:
    TVar14 = lj_ir_kgc(J,(GCobj *)(ulong)*(uint *)((ulong)(J->pt->k).ptr32 + ~local_f0 * 4),IRT_TAB)
    ;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x508b0000;
LAB_00149f24:
    uVar33 = lj_opt_fold(J);
    goto LAB_001498ad;
  case IR_SUBOV:
  case IR_MULOV:
    local_e8.field_2.it = 0xfffffff4;
    local_e8.field_2.field_0 =
         (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)(J->fn->c).env.gcptr32
    ;
    TVar14 = getcurrf(J);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x440b0001;
    local_b8 = lj_opt_fold(J);
    local_a4 = 100;
    goto LAB_001498a8;
  case IR_AREF:
  case IR_HREFK:
  case IR_UREFO:
  case IR_UREFC:
    goto switchD_001494bd_caseD_38;
  case IR_HREF:
  case IR_FREF:
    TStack_e0.n = (lua_Number)(int)lnk;
    TVar14 = lj_ir_kint(J,lnk);
    IStack_b4 = (IRRef1)TVar14;
    uStack_b2 = (undefined2)(TVar14 >> 0x10);
    goto switchD_001494bd_caseD_38;
  case IR_NEWREF:
  case IR_LREF:
    local_a4 = 0;
LAB_001498a8:
    uVar33 = lj_record_idx(J,(RecordIndex *)&local_e8.field_2);
LAB_001498ad:
    local_f0 = (ulong)uVar33;
    break;
  case IR_STRREF:
    pTVar6 = J->L->base;
    pTVar36 = J->L->top;
    k = TStack_e0._0_4_;
    uVar33 = (uint)local_108 - 1;
    local_78.field_2.it = 0xfffffff4;
    local_78.field_2.field_0 =
         (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)
         (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)pTVar6[uVar33].u32.lo;
    local_48 = J->base[uVar33];
    if (local_48 == 0) {
      local_48 = sload(J,uVar33);
    }
    local_34 = 0;
    for (uVar39 = local_108; uVar39 < ((ulong)((long)pTVar36 - (long)pTVar6) >> 3 & 0xffffffff);
        uVar39 = uVar39 + 1) {
      local_70 = (double)(int)k;
      local_44 = lj_ir_kint(J,k);
      local_68 = pTVar6[uVar39];
      TVar14 = J->base[uVar39];
      if (TVar14 == 0) {
        TVar14 = sload(J,(int32_t)uVar39);
      }
      local_40 = TVar14;
      lj_record_idx(J,(RecordIndex *)&local_78.field_2);
      k = k + 1;
    }
    J->maxslot = (uint)local_108;
    break;
  case IR_ALOAD:
    local_f0 = (ulong)((int)((ulong)((long)J->L->top - (long)J->L->base) >> 3) - (uint)local_108);
    goto LAB_00149fc6;
  case IR_HLOAD:
    goto LAB_00149fc6;
  case IR_ULOAD:
    local_f0 = (ulong)((int)((ulong)((long)J->L->top - (long)J->L->base) >> 3) - (uint)local_108);
    goto LAB_0014a0d3;
  case IR_FLOAD:
LAB_0014a0d3:
    lj_record_tailcall(J,(uint)local_108,local_f0 - 1);
    break;
  case IR_XLOAD:
    pTVar23 = J->base;
    TVar14 = pTVar23[(uint)local_108 - 3];
    if (TVar14 == 0) {
      TVar14 = sload(J,(uint)local_108 - 3);
      pTVar23 = J->base;
    }
    pTVar23[local_108] = TVar14;
    TVar14 = pTVar23[(uint)local_108 - 2];
    if (TVar14 == 0) {
      TVar14 = sload(J,(uint)local_108 - 2);
      pTVar23 = J->base;
    }
    pTVar23[(uint)local_108 + 1] = TVar14;
    TVar14 = pTVar23[(uint)local_108 - 1];
    if (TVar14 == 0) {
      TVar14 = sload(J,(uint)local_108 - 1);
      pTVar23 = J->base;
    }
    pTVar23[(uint)local_108 + 2] = TVar14;
    pTVar6 = J->L->base;
    TVar9 = (pTVar6 + (local_108 - 3))[1];
    pTVar6[local_108] = pTVar6[local_108 - 3];
    (pTVar6 + local_108)[1] = TVar9;
    pTVar6[local_108 + 2] = pTVar6[local_108 - 1];
LAB_00149fc6:
    lj_record_call(J,(uint)local_108,local_f0 - 1);
    break;
  case IR_VLOAD:
    bVar3 = J->pt->numparams;
    uVar29 = (ulong)bVar3;
    lVar34 = (long)(*(int *)((long)J->L->base + -4) >> 3);
    uVar39 = ~uVar29 + lVar34;
    if (0 < J->framedepth) {
      uVar29 = 0;
      if (0 < (long)uVar39) {
        uVar29 = uVar39;
      }
      if (uVar26 == 2) {
        uVar33 = J->maxslot;
        uStack_120 = 1;
        if (uVar33 <= (uint)local_108) {
          uVar33 = (uint)local_108 + 1;
          goto LAB_0014a179;
        }
      }
      else {
        uStack_120 = uVar30 - 1;
        if (uVar26 == 0) {
          uStack_120 = uVar29;
        }
        uVar33 = (uint)local_108 + (int)uStack_120;
LAB_0014a179:
        J->maxslot = uVar33;
      }
      if (0xf9 < uVar33 + J->baseslot) {
        TVar10 = LJ_TRERR_STACKOV;
LAB_0014b0e0:
        lj_trace_err(J,TVar10);
      }
      for (uVar30 = 0; uStack_120 != uVar30; uVar30 = uVar30 + 1) {
        pTVar23 = J->base;
        TVar14 = 0x7fff;
        if (((long)uVar30 < (long)uVar39) && (TVar14 = pTVar23[~uVar29 + uVar30], TVar14 == 0)) {
          TVar14 = sload(J,(-1 - (int)uVar29) + (int)uVar30);
          pTVar23 = J->base;
        }
        pTVar23[local_108 + uVar30] = TVar14;
      }
      goto switchD_001494bd_caseD_27;
    }
    (J->fold).ins.field_0.ot = 0x4613;
    (J->fold).ins.field_1.op12 = 0x120000;
    local_98 = uVar30 - 1;
    TVar14 = lj_opt_fold(J);
    uVar33 = (uint)bVar3 * 8;
    uVar15 = (uint)bVar3 * 8 + 0xb;
    uVar30 = (ulong)uVar15;
    IVar11 = (IRRef1)TVar14;
    if (uVar26 != 0) {
      if ((long)uVar39 < 1) {
        TVar14 = lj_ir_kint(J,uVar15);
        (J->fold).ins.field_0.ot = 0x293;
        (J->fold).ins.field_0.op1 = IVar11;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar14;
        lj_opt_fold(J);
        uVar39 = 0;
      }
      else {
        if (uVar39 < local_98) {
          iVar31 = *(int32_t *)((long)J->L->base + -4);
          IVar25 = 0x893;
          uVar30 = uVar39;
        }
        else {
          iVar31 = uVar15 + (int)local_98 * 8;
          IVar25 = 0x193;
          uVar30 = local_98;
        }
        TVar14 = lj_ir_kint(J,iVar31);
        (J->fold).ins.field_0.ot = IVar25;
        (J->fold).ins.field_0.op1 = IVar11;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar14;
        lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x2a13;
        (J->fold).ins.field_0.op1 = 0x8000;
        (J->fold).ins.field_0.op2 = IVar11;
        TVar14 = lj_opt_fold(J);
        TVar19 = lj_ir_kint(J,uVar33 | 3);
        (J->fold).ins.field_0.ot = 0x2905;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar19;
        TVar14 = lj_opt_fold(J);
        local_a0 = local_108 * 4;
        for (uVar35 = 0; uVar30 != uVar35; uVar35 = uVar35 + 1) {
          uVar33 = *(uint *)((long)J->L->base + uVar35 * 8 + (uVar29 * 8 + lVar34 * -8 | 4));
          uVar15 = ~uVar33;
          if ((uVar33 & 0xffff8000) == 0xffff0000) {
            uVar15 = 3;
          }
          if (uVar33 < 0xfffeffff) {
            uVar15 = 0xe;
          }
          TVar19 = lj_ir_kint(J,(int32_t)uVar35);
          (J->fold).ins.field_0.ot = 0x3805;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar19;
          TVar19 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = (ushort)uVar15 | 0x4780;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar19;
          (J->fold).ins.field_0.op2 = 0;
          TVar20 = lj_opt_fold(J);
          TVar19 = uVar15 * 0xffffff + 0x7fff;
          if (2 < uVar15) {
            TVar19 = TVar20;
          }
          *(TRef *)((long)J->base + uVar35 * 4 + local_a0) = TVar19;
        }
      }
      for (; (long)uVar39 < (long)local_98; uVar39 = uVar39 + 1) {
        J->base[local_108 + uVar39] = 0x7fff;
      }
      if ((local_98 != 1) || (J->maxslot <= (uint)local_108)) {
        J->maxslot = (int)local_98 + (uint)local_108;
      }
      break;
    }
    local_a0 = uVar30;
    local_88 = uVar29;
    if ((J->pc[1] & 0xffff00ff) != 0x2010041) {
LAB_0014b0f3:
      (J->errinfo).u64 = 0x4051c00000000000;
      lj_trace_err_info(J,LJ_TRERR_NYIBC);
    }
    pTVar6 = J->L->base;
    uVar15 = J->pc[1] >> 8 & 0xff;
    uVar29 = (ulong)uVar15;
    if ((*(int *)((long)pTVar6 + uVar29 * 8 + 4) != -9) ||
       (o = (GCobj *)(ulong)pTVar6[uVar29].u32.lo, (o->gch).unused1 != '\x10')) goto LAB_0014b0f3;
    TVar19 = lj_ir_kgc(J,o,IRT_FUNC);
    TVar14 = J->base[uVar29];
    if (TVar14 == 0) {
      TVar14 = sload(J,uVar15);
    }
    (J->fold).ins.field_0.ot = 0x888;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar19;
    lj_opt_fold(J);
    uVar29 = (ulong)((uint)local_108 - 1);
    TVar14 = J->base[uVar29];
    if (TVar14 == 0) {
      TVar14 = sload(J,(uint)local_108 - 1);
    }
    local_98 = uVar29;
    iVar31 = lj_ffrecord_select_mode(J,TVar14,J->L->base + uVar29);
    if (iVar31 < 0) goto LAB_0014b0f3;
    lVar34 = (long)iVar31;
    local_80 = lVar34;
    if (iVar31 == 0) {
LAB_0014a9a1:
      if ((long)uVar39 < lVar34) {
        TVar19 = lj_ir_kint(J,(int32_t)local_a0);
        IVar12 = (IRRef1)TVar19;
        if (iVar31 == 0) {
          TVar19 = lj_ir_kint(J,0);
        }
        else {
          TVar19 = lj_ir_kint(J,3);
          (J->fold).ins.field_0.ot = 0x2413;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar19;
          TVar19 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = 0x2913;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar19;
          (J->fold).ins.field_0.op2 = IVar12;
          TVar19 = lj_opt_fold(J);
          IVar12 = (IRRef1)TVar19;
          TVar19 = 0x7fff;
        }
        (J->fold).ins.field_0.ot = 0x93;
        (J->fold).ins.field_0.op1 = IVar11;
        (J->fold).ins.field_0.op2 = IVar12;
        lj_opt_fold(J);
        goto LAB_0014adc6;
      }
      TVar19 = lj_ir_kint(J,(uint)bVar3 * -8 + -0xb);
      (J->fold).ins.field_0.ot = 0x2913;
      (J->fold).ins.field_0.op1 = IVar11;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar19;
      TVar19 = lj_opt_fold(J);
      if (local_88 != 0) {
        TVar20 = lj_ir_kint(J,0);
        (J->fold).ins.field_0.ot = 0x193;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar19;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar20;
        lj_opt_fold(J);
      }
      TVar20 = lj_ir_kint(J,3);
      (J->fold).ins.field_0.ot = 0x2513;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar19;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar20;
      TVar19 = lj_opt_fold(J);
      if (iVar31 != 0) {
        TVar20 = lj_ir_kint(J,-1);
        (J->fold).ins.field_0.ot = 0x2913;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar20;
        TVar14 = lj_opt_fold(J);
        rec_idx_abc(J,TVar19,TVar14,(uint32_t)uVar39);
        goto LAB_0014adc6;
      }
    }
    else {
      if (4 < (TVar14 >> 0x18 & 0x1f) - 0xf) {
        if ((TVar14 & 0x1f000000) == 0x4000000) {
          (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5c8e0000;
          TVar14 = lj_opt_fold(J);
        }
        (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5993226e;
        TVar14 = lj_opt_fold(J);
      }
      if ((short)TVar14 < 0) goto LAB_0014a9a1;
      TVar19 = lj_ir_kint(J,(int)local_a0 + iVar31 * 8);
      (J->fold).ins.field_0.ot = (ushort)(lVar34 <= (long)uVar39) << 8 | 0x93;
      (J->fold).ins.field_0.op1 = IVar11;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar19;
      lj_opt_fold(J);
      local_a0 = (ulong)(uVar33 | 3);
      TVar19 = 0x7fff;
LAB_0014adc6:
      if ((iVar31 != 0) && (lVar34 = local_80 - uVar39, lVar34 == 0 || local_80 < (long)uVar39)) {
        (J->fold).ins.field_0.ot = 0x2a13;
        (J->fold).ins.field_0.op1 = 0x8000;
        (J->fold).ins.field_0.op2 = IVar11;
        TVar19 = lj_opt_fold(J);
        TVar20 = lj_ir_kint(J,(int)local_a0 + -8);
        (J->fold).ins.field_0.ot = 0x2905;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar19;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar20;
        TVar19 = lj_opt_fold(J);
        uVar33 = *(uint *)((long)J->L->base + lVar34 * 8 + -0xc);
        uVar15 = 3;
        if ((uVar33 & 0xffff8000) != 0xffff0000) {
          uVar15 = ~uVar33;
        }
        uVar26 = 0xe;
        if (0xfffefffe < uVar33) {
          uVar26 = uVar15;
        }
        (J->fold).ins.field_0.ot = 0x3805;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar19;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar14;
        TVar14 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = (ushort)uVar26 | 0x4780;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar14;
        (J->fold).ins.field_0.op2 = 0;
        TVar14 = lj_opt_fold(J);
        TVar19 = uVar26 * 0xffffff + 0x7fff;
        if (2 < uVar26) {
          TVar19 = TVar14;
        }
      }
    }
    J->base[(uint)local_108 - 2] = TVar19;
    J->maxslot = (BCReg)local_98;
    J->bcskip = '\x02';
    break;
  case IR_HSTORE:
    local_f0 = (ulong)(((int)((ulong)((long)J->L->top - (long)J->L->base) >> 3) - (uint)local_108) +
                      1);
    goto LAB_001499bf;
  case IR_USTORE:
  case IR_FSTORE:
  case IR_XSTORE:
LAB_001499bf:
    if (J->prof_mode == 0x66) {
      (J->fold).ins.field_0.ot = 0x1580;
      (J->fold).ins.field_1.op12 = 0;
      lj_opt_fold(J);
      J->prev_pt = (GCproto *)0x0;
      lj_snap_add(J);
    }
    lj_record_ret(J,(uint)local_108,local_f0 - 1);
    break;
  case IR_SNEW:
    LVar17 = rec_for(J,pc,0);
    if (LVar17 != LOOPEV_LEAVE) {
      J->loopref = (J->cur).nins;
    }
    break;
  case IR_XSNEW:
    LVar17 = rec_for(J,pc,0);
    if (LVar17 != LOOPEV_LEAVE) {
      lj_record_stop(J,LJ_TRLINK_ROOT,(uint)*(ushort *)((long)pc + local_f0 * 4 + -0x1fffe));
    }
    break;
  case IR_TNEW:
    LVar17 = rec_for(J,pc + (local_f0 - 0x8000),1);
    goto LAB_00149edc;
  case IR_TDUP:
  case IR_BUFHDR:
  case IR_TBAR:
  case IR_TOBIT:
  case IR_CALLN:
    TVar10 = LJ_TRERR_BLACKL;
    goto LAB_0014b0e0;
  case IR_CNEW:
    LVar17 = rec_for(J,pc + ((ulong)*(ushort *)((ulong)J->trace[local_f0].gcptr32 + 0x3a) - 0x8000),
                     1);
    goto LAB_0014a2bc;
  case IR_CNEWI:
    LVar17 = rec_iterl(J,*pc);
LAB_00149edc:
    rec_loop_interp(J,pc,LVar17);
    break;
  case IR_BUFPUT:
    LVar17 = rec_iterl(J,*(BCIns *)((ulong)J->trace[local_f0].gcptr32 + 0x38));
LAB_0014a2bc:
    rec_loop_jit(J,lnk,LVar17);
    break;
  case IR_BUFSTR:
    if ((uint)local_108 < J->maxslot) {
      J->maxslot = (uint)local_108;
    }
    J->pc = J->pc + 1;
    rec_loop_interp(J,pc,LOOPEV_ENTER);
    break;
  case IR_OBAR:
    bVar3 = *(byte *)((ulong)J->trace[local_f0].gcptr32 + 0x38);
    if ((uint)local_108 < J->maxslot) {
      J->maxslot = (uint)local_108;
    }
    J->pc = J->pc + (bVar3 - 0x4d < 0xfffffffc);
    rec_loop_jit(J,lnk,LOOPEV_ENTER);
    break;
  case IR_XBAR:
    if ((uint)local_108 < J->maxslot) {
      J->maxslot = (uint)local_108;
    }
    break;
  case IR_CONV:
    rec_func_lua(J);
    break;
  case IR_TOSTR:
    rec_func_setup(J);
    uVar39 = (ulong)J->trace[local_f0].gcptr32;
    if (*(char *)(uVar39 + 0x5c) == '\a') {
      check_call_unroll(J,lnk);
      pBVar7 = J->pc;
      J->patchins = *pBVar7;
      J->patchpc = pBVar7;
      *pBVar7 = *(BCIns *)(uVar39 + 0x38);
    }
    else {
      J->instunroll = 0;
      if ((J->pc == J->startpc) && (J->framedepth + J->retdepth == 0)) {
        lnk = (TraceNo)(J->cur).traceno;
        linktype = LJ_TRLINK_TAILREC;
      }
      else {
        linktype = LJ_TRLINK_ROOT;
      }
      lj_record_stop(J,linktype,lnk);
    }
    break;
  case IR_STRTO:
    pGVar4 = J->pt;
    uVar33 = J->maxslot + 1;
    if (0xf9 < (uint)pGVar4->framesize + J->baseslot + uVar33) {
      TVar10 = LJ_TRERR_STACKOV;
      goto LAB_0014b0b6;
    }
    pTVar23 = J->base;
    pTVar23[J->maxslot] = pTVar23[-1];
    uVar15 = (uint)pGVar4->numparams;
    if (J->maxslot < uVar15) {
      uVar15 = J->maxslot;
    }
    for (uVar39 = 0; uVar15 != uVar39; uVar39 = uVar39 + 1) {
      pTVar23[uVar33 + (int)uVar39] = pTVar23[uVar39];
      pTVar23[uVar39] = 0x7fff;
    }
    J->maxslot = uVar15;
    J->framedepth = J->framedepth + 1;
    J->base = pTVar23 + uVar33;
    J->baseslot = J->baseslot + uVar33;
    rec_func_lua(J);
    break;
  case IR_CALLL:
  case IR_CALLS:
    goto switchD_001494bd_caseD_5f;
  default:
    if (IVar21 < IR_CALLXS) goto switchD_001494bd_caseD_32;
    goto switchD_001494bd_caseD_5f;
  }
LAB_0014a394:
  if (((short)local_8c == 1) && ((TRef)local_f0 != 0)) {
    J->base[local_108] = (TRef)local_f0;
    if (J->maxslot <= (uint)local_108) {
      J->maxslot = (uint)local_108 + 1;
    }
  }
LAB_0014a467:
  if (((J->cur).nins <= J->param[1] + 0x8001U) && (0x8000U - J->param[2] <= (J->cur).nk)) {
    return;
  }
  TVar10 = LJ_TRERR_TRACEOV;
LAB_0014b0b6:
  lj_trace_err(J,TVar10);
switchD_001494bd_caseD_5f:
  lj_ffrecord_func(J);
  goto LAB_0014a394;
switchD_001494bd_caseD_38:
  local_a4 = 100;
  goto LAB_001498a8;
}

Assistant:

void lj_record_ins(jit_State *J)
{
  cTValue *lbase;
  RecordIndex ix;
  const BCIns *pc;
  BCIns ins;
  BCOp op;
  TRef ra, rb, rc;

  /* Perform post-processing action before recording the next instruction. */
  if (LJ_UNLIKELY(J->postproc != LJ_POST_NONE)) {
    switch (J->postproc) {
    case LJ_POST_FIXCOMP:  /* Fixup comparison. */
      pc = (const BCIns *)(uintptr_t)J2G(J)->tmptv.u64;
      rec_comp_fixup(J, pc, (!tvistruecond(&J2G(J)->tmptv2) ^ (bc_op(*pc)&1)));
      /* fallthrough */
    case LJ_POST_FIXGUARD:  /* Fixup and emit pending guard. */
    case LJ_POST_FIXGUARDSNAP:  /* Fixup and emit pending guard and snapshot. */
      if (!tvistruecond(&J2G(J)->tmptv2)) {
	J->fold.ins.o ^= 1;  /* Flip guard to opposite. */
	if (J->postproc == LJ_POST_FIXGUARDSNAP) {
	  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
	  J->cur.snapmap[snap->mapofs+snap->nent-1]--;  /* False -> true. */
	}
      }
      lj_opt_fold(J);  /* Emit pending guard. */
      /* fallthrough */
    case LJ_POST_FIXBOOL:
      if (!tvistruecond(&J2G(J)->tmptv2)) {
	BCReg s;
	TValue *tv = J->L->base;
	for (s = 0; s < J->maxslot; s++)  /* Fixup stack slot (if any). */
	  if (J->base[s] == TREF_TRUE && tvisfalse(&tv[s])) {
	    J->base[s] = TREF_FALSE;
	    break;
	  }
      }
      break;
    case LJ_POST_FIXCONST:
      {
	BCReg s;
	TValue *tv = J->L->base;
	for (s = 0; s < J->maxslot; s++)  /* Constify stack slots (if any). */
	  if (J->base[s] == TREF_NIL && !tvisnil(&tv[s]))
	    J->base[s] = lj_record_constify(J, &tv[s]);
      }
      break;
    case LJ_POST_FFRETRY:  /* Suppress recording of retried fast function. */
      if (bc_op(*J->pc) >= BC__MAX)
	return;
      break;
    default: lj_assertJ(0, "bad post-processing mode"); break;
    }
    J->postproc = LJ_POST_NONE;
  }

  /* Need snapshot before recording next bytecode (e.g. after a store). */
  if (J->needsnap) {
    J->needsnap = 0;
    if (J->pt) lj_snap_purge(J);
    lj_snap_add(J);
    J->mergesnap = 1;
  }

  /* Skip some bytecodes. */
  if (LJ_UNLIKELY(J->bcskip > 0)) {
    J->bcskip--;
    return;
  }

  /* Record only closed loops for root traces. */
  pc = J->pc;
  if (J->framedepth == 0 &&
     (MSize)((char *)pc - (char *)J->bc_min) >= J->bc_extent)
    lj_trace_err(J, LJ_TRERR_LLEAVE);

#ifdef LUA_USE_ASSERT
  rec_check_slots(J);
  rec_check_ir(J);
#endif

#if LJ_HASPROFILE
  rec_profile_ins(J, pc);
#endif

  /* Keep a copy of the runtime values of var/num/str operands. */
#define rav	(&ix.valv)
#define rbv	(&ix.tabv)
#define rcv	(&ix.keyv)

  lbase = J->L->base;
  ins = *pc;
  op = bc_op(ins);
  ra = bc_a(ins);
  ix.val = 0;
  switch (bcmode_a(op)) {
  case BCMvar:
    copyTV(J->L, rav, &lbase[ra]); ix.val = ra = getslot(J, ra); break;
  default: break;  /* Handled later. */
  }
  rb = bc_b(ins);
  rc = bc_c(ins);
  switch (bcmode_b(op)) {
  case BCMnone: rb = 0; rc = bc_d(ins); break;  /* Upgrade rc to 'rd'. */
  case BCMvar:
    copyTV(J->L, rbv, &lbase[rb]); ix.tab = rb = getslot(J, rb); break;
  default: break;  /* Handled later. */
  }
  switch (bcmode_c(op)) {
  case BCMvar:
    copyTV(J->L, rcv, &lbase[rc]); ix.key = rc = getslot(J, rc); break;
  case BCMpri: setpriV(rcv, ~rc); ix.key = rc = TREF_PRI(IRT_NIL+rc); break;
  case BCMnum: { cTValue *tv = proto_knumtv(J->pt, rc);
    copyTV(J->L, rcv, tv); ix.key = rc = tvisint(tv) ? lj_ir_kint(J, intV(tv)) :
    lj_ir_knumint(J, numV(tv)); } break;
  case BCMstr: { GCstr *s = gco2str(proto_kgc(J->pt, ~(ptrdiff_t)rc));
    setstrV(J->L, rcv, s); ix.key = rc = lj_ir_kstr(J, s); } break;
  default: break;  /* Handled later. */
  }

  switch (op) {

  /* -- Comparison ops ---------------------------------------------------- */

  case BC_ISLT: case BC_ISGE: case BC_ISLE: case BC_ISGT:
#if LJ_HASFFI
    if (tref_iscdata(ra) || tref_iscdata(rc)) {
      rec_mm_comp_cdata(J, &ix, op, ((int)op & 2) ? MM_le : MM_lt);
      break;
    }
#endif
    /* Emit nothing for two numeric or string consts. */
    if (!(tref_isk2(ra,rc) && tref_isnumber_str(ra) && tref_isnumber_str(rc))) {
      IRType ta = tref_isinteger(ra) ? IRT_INT : tref_type(ra);
      IRType tc = tref_isinteger(rc) ? IRT_INT : tref_type(rc);
      int irop;
      if (ta != tc) {
	/* Widen mixed number/int comparisons to number/number comparison. */
	if (ta == IRT_INT && tc == IRT_NUM) {
	  ra = emitir(IRTN(IR_CONV), ra, IRCONV_NUM_INT);
	  ta = IRT_NUM;
	} else if (ta == IRT_NUM && tc == IRT_INT) {
	  rc = emitir(IRTN(IR_CONV), rc, IRCONV_NUM_INT);
	} else if (LJ_52) {
	  ta = IRT_NIL;  /* Force metamethod for different types. */
	} else if (!((ta == IRT_FALSE || ta == IRT_TRUE) &&
		     (tc == IRT_FALSE || tc == IRT_TRUE))) {
	  break;  /* Interpreter will throw for two different types. */
	}
      }
      rec_comp_prep(J);
      irop = (int)op - (int)BC_ISLT + (int)IR_LT;
      if (ta == IRT_NUM) {
	if ((irop & 1)) irop ^= 4;  /* ISGE/ISGT are unordered. */
	if (!lj_ir_numcmp(numberVnum(rav), numberVnum(rcv), (IROp)irop))
	  irop ^= 5;
      } else if (ta == IRT_INT) {
	if (!lj_ir_numcmp(numberVnum(rav), numberVnum(rcv), (IROp)irop))
	  irop ^= 1;
      } else if (ta == IRT_STR) {
	if (!lj_ir_strcmp(strV(rav), strV(rcv), (IROp)irop)) irop ^= 1;
	ra = lj_ir_call(J, IRCALL_lj_str_cmp, ra, rc);
	rc = lj_ir_kint(J, 0);
	ta = IRT_INT;
      } else {
	rec_mm_comp(J, &ix, (int)op);
	break;
      }
      emitir(IRTG(irop, ta), ra, rc);
      rec_comp_fixup(J, J->pc, ((int)op ^ irop) & 1);
    }
    break;

  case BC_ISEQV: case BC_ISNEV:
  case BC_ISEQS: case BC_ISNES:
  case BC_ISEQN: case BC_ISNEN:
  case BC_ISEQP: case BC_ISNEP:
#if LJ_HASFFI
    if (tref_iscdata(ra) || tref_iscdata(rc)) {
      rec_mm_comp_cdata(J, &ix, op, MM_eq);
      break;
    }
#endif
    /* Emit nothing for two non-table, non-udata consts. */
    if (!(tref_isk2(ra, rc) && !(tref_istab(ra) || tref_isudata(ra)))) {
      int diff;
      rec_comp_prep(J);
      diff = lj_record_objcmp(J, ra, rc, rav, rcv);
      if (diff == 2 || !(tref_istab(ra) || tref_isudata(ra)))
	rec_comp_fixup(J, J->pc, ((int)op & 1) == !diff);
      else if (diff == 1)  /* Only check __eq if different, but same type. */
	rec_mm_equal(J, &ix, (int)op);
    }
    break;

  /* -- Unary test and copy ops ------------------------------------------- */

  case BC_ISTC: case BC_ISFC:
    if ((op & 1) == tref_istruecond(rc))
      rc = 0;  /* Don't store if condition is not true. */
    /* fallthrough */
  case BC_IST: case BC_ISF:  /* Type specialization suffices. */
    if (bc_a(pc[1]) < J->maxslot)
      J->maxslot = bc_a(pc[1]);  /* Shrink used slots. */
    break;

  case BC_ISTYPE: case BC_ISNUM:
    /* These coercions need to correspond with lj_meta_istype(). */
    if (LJ_DUALNUM && rc == ~LJ_TNUMX+1)
      ra = lj_opt_narrow_toint(J, ra);
    else if (rc == ~LJ_TNUMX+2)
      ra = lj_ir_tonum(J, ra);
    else if (rc == ~LJ_TSTR+1)
      ra = lj_ir_tostr(J, ra);
    /* else: type specialization suffices. */
    J->base[bc_a(ins)] = ra;
    break;

  /* -- Unary ops --------------------------------------------------------- */

  case BC_NOT:
    /* Type specialization already forces const result. */
    rc = tref_istruecond(rc) ? TREF_FALSE : TREF_TRUE;
    break;

  case BC_LEN:
    if (tref_isstr(rc))
      rc = emitir(IRTI(IR_FLOAD), rc, IRFL_STR_LEN);
    else if (!LJ_52 && tref_istab(rc))
      rc = lj_ir_call(J, IRCALL_lj_tab_len, rc);
    else
      rc = rec_mm_len(J, rc, rcv);
    break;

  /* -- Arithmetic ops ---------------------------------------------------- */

  case BC_UNM:
    if (tref_isnumber_str(rc)) {
      rc = lj_opt_narrow_unm(J, rc, rcv);
    } else {
      ix.tab = rc;
      copyTV(J->L, &ix.tabv, rcv);
      rc = rec_mm_arith(J, &ix, MM_unm);
    }
    break;

  case BC_ADDNV: case BC_SUBNV: case BC_MULNV: case BC_DIVNV: case BC_MODNV:
    /* Swap rb/rc and rbv/rcv. rav is temp. */
    ix.tab = rc; ix.key = rc = rb; rb = ix.tab;
    copyTV(J->L, rav, rbv);
    copyTV(J->L, rbv, rcv);
    copyTV(J->L, rcv, rav);
    if (op == BC_MODNV)
      goto recmod;
    /* fallthrough */
  case BC_ADDVN: case BC_SUBVN: case BC_MULVN: case BC_DIVVN:
  case BC_ADDVV: case BC_SUBVV: case BC_MULVV: case BC_DIVVV: {
    MMS mm = bcmode_mm(op);
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_arith(J, rb, rc, rbv, rcv,
			       (int)mm - (int)MM_add + (int)IR_ADD);
    else
      rc = rec_mm_arith(J, &ix, mm);
    break;
    }

  case BC_MODVN: case BC_MODVV:
  recmod:
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_mod(J, rb, rc, rbv, rcv);
    else
      rc = rec_mm_arith(J, &ix, MM_mod);
    break;

  case BC_POW:
    if (tref_isnumber_str(rb) && tref_isnumber_str(rc))
      rc = lj_opt_narrow_arith(J, rb, rc, rbv, rcv, IR_POW);
    else
      rc = rec_mm_arith(J, &ix, MM_pow);
    break;

  /* -- Miscellaneous ops ------------------------------------------------- */

  case BC_CAT:
    rc = rec_cat(J, rb, rc);
    if (rc >= 0xffffff00)
      lj_err_throw(J->L, -(int32_t)rc);  /* Propagate errors. */
    break;

  /* -- Constant and move ops --------------------------------------------- */

  case BC_MOV:
    /* Clear gap of method call to avoid resurrecting previous refs. */
    if (ra > J->maxslot) {
#if LJ_FR2
      memset(J->base + J->maxslot, 0, (ra - J->maxslot) * sizeof(TRef));
#else
      J->base[ra-1] = 0;
#endif
    }
    break;
  case BC_KSTR: case BC_KNUM: case BC_KPRI:
    break;
  case BC_KSHORT:
    rc = lj_ir_kint(J, (int32_t)(int16_t)rc);
    break;
  case BC_KNIL:
    if (LJ_FR2 && ra > J->maxslot)
      J->base[ra-1] = 0;
    while (ra <= rc)
      J->base[ra++] = TREF_NIL;
    if (rc >= J->maxslot) J->maxslot = rc+1;
    break;
#if LJ_HASFFI
  case BC_KCDATA:
    rc = lj_ir_kgc(J, proto_kgc(J->pt, ~(ptrdiff_t)rc), IRT_CDATA);
    break;
#endif

  /* -- Upvalue and function ops ------------------------------------------ */

  case BC_UGET:
    rc = rec_upvalue(J, rc, 0);
    break;
  case BC_USETV: case BC_USETS: case BC_USETN: case BC_USETP:
    rec_upvalue(J, ra, rc);
    break;

  /* -- Table ops --------------------------------------------------------- */

  case BC_GGET: case BC_GSET:
    settabV(J->L, &ix.tabv, tabref(J->fn->l.env));
    ix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), getcurrf(J), IRFL_FUNC_ENV);
    ix.idxchain = LJ_MAX_IDXCHAIN;
    rc = lj_record_idx(J, &ix);
    break;

  case BC_TGETB: case BC_TSETB:
    setintV(&ix.keyv, (int32_t)rc);
    ix.key = lj_ir_kint(J, (int32_t)rc);
    /* fallthrough */
  case BC_TGETV: case BC_TGETS: case BC_TSETV: case BC_TSETS:
    ix.idxchain = LJ_MAX_IDXCHAIN;
    rc = lj_record_idx(J, &ix);
    break;
  case BC_TGETR: case BC_TSETR:
    ix.idxchain = 0;
    rc = lj_record_idx(J, &ix);
    break;

  case BC_TSETM:
    rec_tsetm(J, ra, (BCReg)(J->L->top - J->L->base), (int32_t)rcv->u32.lo);
    J->maxslot = ra;  /* The table slot at ra-1 is the highest used slot. */
    break;

  case BC_TNEW:
    rc = rec_tnew(J, rc);
    break;
  case BC_TDUP:
    rc = emitir(IRTG(IR_TDUP, IRT_TAB),
		lj_ir_ktab(J, gco2tab(proto_kgc(J->pt, ~(ptrdiff_t)rc))), 0);
#ifdef LUAJIT_ENABLE_TABLE_BUMP
    J->rbchash[(rc & (RBCHASH_SLOTS-1))].ref = tref_ref(rc);
    setmref(J->rbchash[(rc & (RBCHASH_SLOTS-1))].pc, pc);
    setgcref(J->rbchash[(rc & (RBCHASH_SLOTS-1))].pt, obj2gco(J->pt));
#endif
    break;

  /* -- Calls and vararg handling ----------------------------------------- */

  case BC_ITERC:
    J->base[ra] = getslot(J, ra-3);
    J->base[ra+1+LJ_FR2] = getslot(J, ra-2);
    J->base[ra+2+LJ_FR2] = getslot(J, ra-1);
    { /* Do the actual copy now because lj_record_call needs the values. */
      TValue *b = &J->L->base[ra];
      copyTV(J->L, b, b-3);
      copyTV(J->L, b+1+LJ_FR2, b-2);
      copyTV(J->L, b+2+LJ_FR2, b-1);
    }
    lj_record_call(J, ra, (ptrdiff_t)rc-1);
    break;

  /* L->top is set to L->base+ra+rc+NARGS-1+1. See lj_dispatch_ins(). */
  case BC_CALLM:
    rc = (BCReg)(J->L->top - J->L->base) - ra - LJ_FR2;
    /* fallthrough */
  case BC_CALL:
    lj_record_call(J, ra, (ptrdiff_t)rc-1);
    break;

  case BC_CALLMT:
    rc = (BCReg)(J->L->top - J->L->base) - ra - LJ_FR2;
    /* fallthrough */
  case BC_CALLT:
    lj_record_tailcall(J, ra, (ptrdiff_t)rc-1);
    break;

  case BC_VARG:
    rec_varg(J, ra, (ptrdiff_t)rb-1);
    break;

  /* -- Returns ----------------------------------------------------------- */

  case BC_RETM:
    /* L->top is set to L->base+ra+rc+NRESULTS-1, see lj_dispatch_ins(). */
    rc = (BCReg)(J->L->top - J->L->base) - ra + 1;
    /* fallthrough */
  case BC_RET: case BC_RET0: case BC_RET1:
#if LJ_HASPROFILE
    rec_profile_ret(J);
#endif
    lj_record_ret(J, ra, (ptrdiff_t)rc-1);
    break;

  /* -- Loops and branches ------------------------------------------------ */

  case BC_FORI:
    if (rec_for(J, pc, 0) != LOOPEV_LEAVE)
      J->loopref = J->cur.nins;
    break;
  case BC_JFORI:
    lj_assertJ(bc_op(pc[(ptrdiff_t)rc-BCBIAS_J]) == BC_JFORL,
	       "JFORI does not point to JFORL");
    if (rec_for(J, pc, 0) != LOOPEV_LEAVE)  /* Link to existing loop. */
      lj_record_stop(J, LJ_TRLINK_ROOT, bc_d(pc[(ptrdiff_t)rc-BCBIAS_J]));
    /* Continue tracing if the loop is not entered. */
    break;

  case BC_FORL:
    rec_loop_interp(J, pc, rec_for(J, pc+((ptrdiff_t)rc-BCBIAS_J), 1));
    break;
  case BC_ITERL:
    rec_loop_interp(J, pc, rec_iterl(J, *pc));
    break;
  case BC_LOOP:
    rec_loop_interp(J, pc, rec_loop(J, ra, 1));
    break;

  case BC_JFORL:
    rec_loop_jit(J, rc, rec_for(J, pc+bc_j(traceref(J, rc)->startins), 1));
    break;
  case BC_JITERL:
    rec_loop_jit(J, rc, rec_iterl(J, traceref(J, rc)->startins));
    break;
  case BC_JLOOP:
    rec_loop_jit(J, rc, rec_loop(J, ra,
				 !bc_isret(bc_op(traceref(J, rc)->startins))));
    break;

  case BC_IFORL:
  case BC_IITERL:
  case BC_ILOOP:
  case BC_IFUNCF:
  case BC_IFUNCV:
    lj_trace_err(J, LJ_TRERR_BLACKL);
    break;

  case BC_JMP:
    if (ra < J->maxslot)
      J->maxslot = ra;  /* Shrink used slots. */
    break;

  /* -- Function headers -------------------------------------------------- */

  case BC_FUNCF:
    rec_func_lua(J);
    break;
  case BC_JFUNCF:
    rec_func_jit(J, rc);
    break;

  case BC_FUNCV:
    rec_func_vararg(J);
    rec_func_lua(J);
    break;
  case BC_JFUNCV:
    /* Cannot happen. No hotcall counting for varag funcs. */
    lj_assertJ(0, "unsupported vararg hotcall");
    break;

  case BC_FUNCC:
  case BC_FUNCCW:
    lj_ffrecord_func(J);
    break;

  default:
    if (op >= BC__MAX) {
      lj_ffrecord_func(J);
      break;
    }
    /* fallthrough */
  case BC_ITERN:
  case BC_ISNEXT:
  case BC_UCLO:
  case BC_FNEW:
    setintV(&J->errinfo, (int32_t)op);
    lj_trace_err_info(J, LJ_TRERR_NYIBC);
    break;
  }

  /* rc == 0 if we have no result yet, e.g. pending __index metamethod call. */
  if (bcmode_a(op) == BCMdst && rc) {
    J->base[ra] = rc;
    if (ra >= J->maxslot) {
#if LJ_FR2
      if (ra > J->maxslot) J->base[ra-1] = 0;
#endif
      J->maxslot = ra+1;
    }
  }

#undef rav
#undef rbv
#undef rcv

  /* Limit the number of recorded IR instructions and constants. */
  if (J->cur.nins > REF_FIRST+(IRRef)J->param[JIT_P_maxrecord] ||
      J->cur.nk < REF_BIAS-(IRRef)J->param[JIT_P_maxirconst])
    lj_trace_err(J, LJ_TRERR_TRACEOV);
}